

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O1

void aspa_table_update_in_place_cleanup(aspa_update_operation **operations,size_t count)

{
  undefined8 *puVar1;
  long lVar2;
  aspa_update_operation *paVar3;
  void *ptr;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((operations != (aspa_update_operation **)0x0) && (*operations != (aspa_update_operation *)0x0)
     ) {
    if (count != 0) {
      lVar4 = 0x28;
      do {
        paVar3 = *operations;
        if ((*(char *)((long)&paVar3->index + lVar4) == '\0') &&
           (*(char *)((long)paVar3 + lVar4 + -0x20) == '\0')) {
          ptr = *(void **)((long)paVar3 + lVar4 + -8);
          if (ptr != (void *)0x0) {
            lrtr_free(ptr);
          }
          puVar1 = (undefined8 *)((long)paVar3 + lVar4 + -0x10);
          *puVar1 = 0;
          puVar1[1] = 0;
        }
        lVar4 = lVar4 + 0x30;
        count = count - 1;
      } while (count != 0);
    }
    lrtr_free(*operations);
    *operations = (aspa_update_operation *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void aspa_table_update_in_place_cleanup(struct aspa_update_operation **operations, size_t count)
{
	if (!operations || !*operations)
		return;

	// If count == 0, this won't be executed
	for (size_t i = 0; i < count; i++) {
		struct aspa_update_operation *op = &(*operations)[i];

		// If it's a remove operation, we inserted a reference to the removed record's providers.
		// Release that provider array now and restore that 'remove'
		// operation back to its original state.
		if (!op->is_no_op && op->type == ASPA_REMOVE) {
			if (op->record.provider_asns)
				lrtr_free(op->record.provider_asns);

			op->record.provider_asns = NULL;
			op->record.provider_count = 0;
		}
	}

	lrtr_free(*operations);
	*operations = NULL;
}